

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

bool __thiscall HttpRequest::handle_headers(HttpRequest *this,CharContent *line,Request *ret)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  mapped_type *this_00;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_168;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_160;
  CharContent local_158;
  CharContent local_130;
  undefined1 local_108 [8];
  CharContent value;
  CharContent local_b8;
  undefined1 local_90 [8];
  CharContent key;
  CharContent local_58;
  size_t local_30;
  size_t pos;
  Request *ret_local;
  CharContent *line_local;
  HttpRequest *this_local;
  
  local_30 = 0;
  pos = (size_t)ret;
  ret_local = (Request *)line;
  line_local = (CharContent *)this;
  CharContent::CharContent(&local_58,":");
  sVar2 = CharContent::find(line,&local_58,0);
  sVar3 = line->npos;
  local_30 = sVar2;
  CharContent::~CharContent(&local_58);
  if (sVar2 == sVar3) {
    this_local._7_1_ = 0;
  }
  else {
    CharContent::subCharContent((CharContent *)local_90,line,0,local_30);
    CharContent::CharContent((CharContent *)&value.m_length," ");
    CharContent::strip(&local_b8,(CharContent *)local_90,(CharContent *)&value.m_length);
    CharContent::operator=((CharContent *)local_90,&local_b8);
    CharContent::~CharContent(&local_b8);
    CharContent::~CharContent((CharContent *)&value.m_length);
    sVar3 = local_30 + 1;
    sVar2 = CharContent::length(line);
    CharContent::subCharContent((CharContent *)local_108,line,sVar3,~local_30 + sVar2);
    CharContent::CharContent(&local_158," ");
    CharContent::strip(&local_130,(CharContent *)local_108,&local_158);
    CharContent::operator=((CharContent *)local_108,&local_130);
    CharContent::~CharContent(&local_130);
    CharContent::~CharContent(&local_158);
    local_160._M_cur =
         (__node_type *)
         std::
         unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
         ::find((unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                 *)(pos + 0xa0),(key_type *)local_90);
    local_168._M_cur =
         (__node_type *)
         std::
         unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
         ::end((unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                *)(pos + 0xa0));
    bVar1 = std::__detail::operator!=(&local_160,&local_168);
    if (!bVar1) {
      this_00 = std::
                unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                ::operator[]((unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                              *)(pos + 0xa0),(key_type *)local_90);
      CharContent::operator=(this_00,(CharContent *)local_108);
    }
    this_local._7_1_ = !bVar1;
    CharContent::~CharContent((CharContent *)local_108);
    CharContent::~CharContent((CharContent *)local_90);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HttpRequest::handle_headers(CharContent line,Request *ret){
	size_t pos=0;
	if((pos=line.find(":"))==line.npos){
		return false;
	}
	CharContent key=line.subCharContent(0,pos);
	key=key.strip(" ");
	CharContent value=line.subCharContent(pos+1,line.length()-pos-1);
	value=value.strip(" ");
	if(ret->headers.find(key)!=ret->headers.end()){
		return false;
	}
	ret->headers[key]=value;
	return true;
}